

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

int __thiscall CMU462::Timeline::previousImportantTime(Timeline *this)

{
  bool bVar1;
  reference piVar2;
  _Self local_28;
  _Self local_20;
  iterator iter;
  Timeline *this_local;
  
  iter._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::lower_bound
                 (&this->times,&this->current_frame);
  local_28._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->times);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    this_local._4_4_ = -1;
  }
  else {
    std::_Rb_tree_const_iterator<int>::operator--(&local_20,0);
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&local_20);
    this_local._4_4_ = *piVar2;
  }
  return this_local._4_4_;
}

Assistant:

int Timeline::previousImportantTime()
  {
	// NOTE : lower bound returns an iter to next > or = element.
	set<int>::iterator iter = times.lower_bound(current_frame);

	if(iter == times.begin())
	{
	  return -1;
	}


	// Iteratres back one key frame.
	// It we are currently on a key frame,
	// then lower bound would have given us back current_frame.
	iter--;

	return *iter;
  }